

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bezier_arc.cpp
# Opt level: O3

int __thiscall agg::bezier_arc_svg::init(bezier_arc_svg *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  uint uVar7;
  char in_DL;
  uint uVar8;
  ulong uVar9;
  undefined4 in_XMM0_Da;
  undefined4 uVar10;
  undefined4 in_XMM0_Db;
  undefined4 uVar11;
  double in_XMM1_Qa;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  double in_XMM3_Qa;
  double dVar15;
  undefined1 auVar16 [16];
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double in_XMM6_Qa;
  double dVar20;
  double dVar21;
  double dVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar25;
  double local_128;
  double local_118;
  undefined8 local_e8;
  trans_affine local_78;
  trans_affine local_48;
  
  cVar6 = (char)ctx;
  local_e8 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  this[0xe0] = (bezier_arc_svg)0x1;
  local_118 = -(double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  dVar15 = ((double)CONCAT44(in_XMM0_Db,in_XMM0_Da) - in_XMM5_Qa) * 0.5;
  dVar12 = (in_XMM1_Qa - in_XMM6_Qa) * 0.5;
  dVar2 = cos(in_XMM4_Qa);
  dVar3 = sin(in_XMM4_Qa);
  if (local_118 <= local_e8) {
    local_118 = local_e8;
  }
  dVar20 = (double)(~-(ulong)(in_XMM3_Qa < 0.0) & (ulong)in_XMM3_Qa |
                   (ulong)-local_118 & -(ulong)(in_XMM3_Qa < 0.0));
  dVar14 = dVar20 * dVar20;
  dVar13 = local_118 * local_118;
  dVar21 = dVar15 * dVar2 + dVar3 * dVar12;
  dVar24 = dVar15 * -dVar3 + dVar2 * dVar12;
  dVar15 = dVar21 * dVar21;
  dVar12 = dVar24 * dVar24;
  auVar23._8_8_ = dVar15;
  auVar23._0_8_ = dVar12;
  auVar18._8_4_ = SUB84(dVar13,0);
  auVar18._0_8_ = dVar14;
  auVar18._12_4_ = (int)((ulong)dVar13 >> 0x20);
  auVar18 = divpd(auVar23,auVar18);
  dVar17 = auVar18._0_8_ + auVar18._8_8_;
  if (1.0 < dVar17) {
    dVar20 = dVar20 * SQRT(dVar17);
    local_118 = local_118 * SQRT(dVar17);
    dVar14 = dVar20 * dVar20;
    dVar13 = local_118 * local_118;
    if (10.0 < dVar17) {
      this[0xe0] = (bezier_arc_svg)0x0;
    }
  }
  auVar19._0_8_ = -dVar14;
  auVar19._8_8_ = -dVar13;
  auVar4._8_4_ = SUB84(dVar13,0);
  auVar4._0_8_ = dVar14;
  auVar4._12_4_ = (int)((ulong)dVar13 >> 0x20);
  auVar18 = blendpd(auVar19,auVar4,2);
  dVar12 = (auVar18._0_8_ * dVar15 + (dVar13 * dVar14 - dVar12 * dVar13)) /
           (auVar18._8_8_ * dVar12 + dVar15 * dVar14);
  dVar15 = 0.0;
  if (0.0 <= dVar12) {
    dVar15 = dVar12;
  }
  dVar15 = SQRT(dVar15);
  if (cVar6 == in_DL) {
    dVar15 = -dVar15;
  }
  dVar17 = ((dVar24 * local_118) / dVar20) * dVar15;
  dVar15 = ((-dVar20 * dVar21) / local_118) * dVar15;
  auVar16._0_8_ = dVar24 - dVar15;
  auVar16._8_8_ = -dVar24 - dVar15;
  auVar5._8_4_ = SUB84(dVar20,0);
  auVar5._0_8_ = dVar20;
  auVar5._12_4_ = (int)((ulong)dVar20 >> 0x20);
  auVar18 = divpd(auVar16,auVar5);
  auVar22._0_8_ = dVar21 - dVar17;
  auVar22._8_8_ = -dVar21 - dVar17;
  auVar1._8_4_ = SUB84(local_118,0);
  auVar1._0_8_ = local_118;
  auVar1._12_4_ = (int)((ulong)local_118 >> 0x20);
  auVar23 = divpd(auVar22,auVar1);
  dVar20 = auVar18._0_8_;
  dVar21 = auVar18._8_8_;
  dVar24 = auVar23._0_8_;
  dVar25 = auVar23._8_8_;
  dVar12 = dVar24 * dVar24 + dVar20 * dVar20;
  dVar13 = dVar24 / SQRT(dVar12);
  dVar14 = -1.0;
  if (-1.0 <= dVar13) {
    dVar14 = dVar13;
  }
  dVar13 = 1.0;
  if (dVar14 <= 1.0) {
    dVar13 = dVar14;
  }
  acos(dVar13);
  dVar12 = (dVar25 * dVar25 + dVar21 * dVar21) * dVar12;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar12 = (dVar24 * dVar25 + dVar20 * dVar21) / dVar12;
  dVar14 = -1.0;
  if (-1.0 <= dVar12) {
    dVar14 = dVar12;
  }
  uVar10 = 0;
  uVar11 = 0x3ff00000;
  if (dVar14 <= 1.0) {
    uVar10 = SUB84(dVar14,0);
    uVar11 = (undefined4)((ulong)dVar14 >> 0x20);
  }
  acos((double)CONCAT44(uVar11,uVar10));
  bezier_arc::init((bezier_arc *)this,ctx);
  dVar12 = cos(in_XMM4_Qa);
  dVar14 = sin(in_XMM4_Qa);
  local_128 = sin(in_XMM4_Qa);
  local_128 = -local_128;
  local_78.sy = cos(in_XMM4_Qa);
  local_78.tx = 0.0;
  local_78.ty = 0.0;
  local_78.shx = local_128;
  local_48.sx = 1.0;
  local_48.shy = 0.0;
  local_48.shx = 0.0;
  local_48.sy = 1.0;
  local_78.sx = dVar12;
  local_78.shy = dVar14;
  local_48.tx = (in_XMM5_Qa + (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) * 0.5 +
                dVar2 * dVar17 + -dVar3 * dVar15;
  local_48.ty = (in_XMM6_Qa + in_XMM1_Qa) * 0.5 + dVar3 * dVar17 + dVar2 * dVar15;
  trans_affine::multiply(&local_78,&local_48);
  uVar7 = *(uint *)(this + 4);
  uVar8 = uVar7 - 2;
  if (2 < uVar8) {
    uVar9 = 2;
    do {
      dVar2 = *(double *)(this + uVar9 * 8 + 8);
      *(double *)(this + uVar9 * 8 + 8) =
           *(double *)(this + uVar9 * 8 + 8) * local_78.sx +
           *(double *)(this + uVar9 * 8 + 0x10) * local_78.shx + local_78.tx;
      *(double *)(this + uVar9 * 8 + 8 + 8) =
           dVar2 * local_78.shy + *(double *)(this + uVar9 * 8 + 0x10) * local_78.sy + local_78.ty;
      uVar9 = uVar9 + 2;
    } while (uVar9 < uVar8);
  }
  *(ulong *)(this + 8) = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  *(double *)(this + 0x10) = in_XMM1_Qa;
  if (2 < uVar7) {
    *(double *)(this + (ulong)uVar8 * 8 + 8) = in_XMM5_Qa;
    uVar7 = uVar7 - 1;
    *(double *)(this + (ulong)uVar7 * 8 + 8) = in_XMM6_Qa;
  }
  return uVar7;
}

Assistant:

void bezier_arc_svg::init(double x0, double y0, 
                              double rx, double ry, 
                              double angle,
                              bool large_arc_flag,
                              bool sweep_flag,
                              double x2, double y2)
    {
        m_radii_ok = true;

        if(rx < 0.0) rx = -rx;
        if(ry < 0.0) ry = -rx;

        // Calculate the middle point between 
        // the current and the final points
        //------------------------
        double dx2 = (x0 - x2) / 2.0;
        double dy2 = (y0 - y2) / 2.0;

        double cos_a = cos(angle);
        double sin_a = sin(angle);

        // Calculate (x1, y1)
        //------------------------
        double x1 =  cos_a * dx2 + sin_a * dy2;
        double y1 = -sin_a * dx2 + cos_a * dy2;

        // Ensure radii are large enough
        //------------------------
        double prx = rx * rx;
        double pry = ry * ry;
        double px1 = x1 * x1;
        double py1 = y1 * y1;

        // Check that radii are large enough
        //------------------------
        double radii_check = px1/prx + py1/pry;
        if(radii_check > 1.0) 
        {
            rx = sqrt(radii_check) * rx;
            ry = sqrt(radii_check) * ry;
            prx = rx * rx;
            pry = ry * ry;
            if(radii_check > 10.0) m_radii_ok = false;
        }

        // Calculate (cx1, cy1)
        //------------------------
        double sign = (large_arc_flag == sweep_flag) ? -1.0 : 1.0;
        double sq   = (prx*pry - prx*py1 - pry*px1) / (prx*py1 + pry*px1);
        double coef = sign * sqrt((sq < 0) ? 0 : sq);
        double cx1  = coef *  ((rx * y1) / ry);
        double cy1  = coef * -((ry * x1) / rx);

        //
        // Calculate (cx, cy) from (cx1, cy1)
        //------------------------
        double sx2 = (x0 + x2) / 2.0;
        double sy2 = (y0 + y2) / 2.0;
        double cx = sx2 + (cos_a * cx1 - sin_a * cy1);
        double cy = sy2 + (sin_a * cx1 + cos_a * cy1);

        // Calculate the start_angle (angle1) and the sweep_angle (dangle)
        //------------------------
        double ux =  (x1 - cx1) / rx;
        double uy =  (y1 - cy1) / ry;
        double vx = (-x1 - cx1) / rx;
        double vy = (-y1 - cy1) / ry;
        double p, n;

        // Calculate the angle start
        //------------------------
        n = sqrt(ux*ux + uy*uy);
        p = ux; // (1 * ux) + (0 * uy)
        sign = (uy < 0) ? -1.0 : 1.0;
        double v = p / n;
        if(v < -1.0) v = -1.0;
        if(v >  1.0) v =  1.0;
        double start_angle = sign * acos(v);

        // Calculate the sweep angle
        //------------------------
        n = sqrt((ux*ux + uy*uy) * (vx*vx + vy*vy));
        p = ux * vx + uy * vy;
        sign = (ux * vy - uy * vx < 0) ? -1.0 : 1.0;
        v = p / n;
        if(v < -1.0) v = -1.0;
        if(v >  1.0) v =  1.0;
        double sweep_angle = sign * acos(v);
        if(!sweep_flag && sweep_angle > 0) 
        {
            sweep_angle -= pi * 2.0;
        } 
        else 
        if (sweep_flag && sweep_angle < 0) 
        {
            sweep_angle += pi * 2.0;
        }

        // We can now build and transform the resulting arc
        //------------------------
        m_arc.init(0.0, 0.0, rx, ry, start_angle, sweep_angle);
        trans_affine mtx = trans_affine_rotation(angle);
        mtx *= trans_affine_translation(cx, cy);
        
        for(unsigned i = 2; i < m_arc.num_vertices()-2; i += 2)
        {
            mtx.transform(m_arc.vertices() + i, m_arc.vertices() + i + 1);
        }

        // We must make sure that the starting and ending points
        // exactly coincide with the initial (x0,y0) and (x2,y2)
        m_arc.vertices()[0] = x0;
        m_arc.vertices()[1] = y0;
        if(m_arc.num_vertices() > 2)
        {
            m_arc.vertices()[m_arc.num_vertices() - 2] = x2;
            m_arc.vertices()[m_arc.num_vertices() - 1] = y2;
        }
    }